

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool __thiscall tinyusdz::Path::has_prefix(Path *this,Path *prefix)

{
  size_type sVar1;
  size_type sVar2;
  __type _Var3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefix_prim_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prim_names;
  allocator local_89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  if ((this->_valid == true) && (prefix->_valid == true)) {
    sVar1 = (prefix->_prim_part)._M_string_length;
    sVar2 = (prefix->_prop_part)._M_string_length;
    if (sVar2 != 0 && sVar1 != 0) {
      full_path_name_abi_cxx11_(&local_50,this);
      full_path_name_abi_cxx11_(&local_70,prefix);
      _Var3 = std::operator==(&local_50,&local_70);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      return _Var3;
    }
    if (sVar2 == 0 && sVar1 != 0) {
      bVar4 = is_root_path(this);
      if ((bVar4) && (bVar4 = is_root_path(prefix), bVar4)) {
        return true;
      }
      if ((((this->_prim_part)._M_string_length != 0) &&
          (*(this->_prim_part)._M_dataplus._M_p == '/')) && (bVar4 = is_root_path(prefix), bVar4)) {
        return true;
      }
      std::__cxx11::string::string((string *)&local_50,"/",(allocator *)&local_88);
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_70,&this->_prim_part,&local_50,0x147ae14);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string((string *)&local_50,"/",&local_89);
      split(&local_88,&prefix->_prim_part,&local_50,0x147ae14);
      std::__cxx11::string::_M_dispose();
      if (((local_70._M_dataplus._M_p == (pointer)local_70._M_string_length) ||
          (local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) ||
         (uVar7 = (long)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
         local_70._M_string_length - (long)local_70._M_dataplus._M_p < uVar7)) {
        bVar4 = false;
      }
      else {
        lVar6 = ((long)uVar7 >> 5) + 1;
        do {
          lVar6 = lVar6 + -1;
          bVar4 = lVar6 == 0;
          if (bVar4) break;
          bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_70._M_dataplus._M_p + (uVar7 - 0x20)),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_88.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-1].
                                             _M_dataplus._M_p + uVar7));
          uVar7 = uVar7 - 0x20;
        } while (!bVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_70);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool Path::has_prefix(const Path &prefix) const {
  if (!is_valid() || !prefix.is_valid()) {
    return false;
  }

  if (prefix.is_prim_property_path()) {
    // No hierarchy in Prim's property path, so use ==.
    return full_path_name() == prefix.full_path_name();
  } else if (prefix.is_prim_path()) {
    // '/', prefix = '/'
    if (is_root_path() && prefix.is_root_path()) {
      // DCOUT("both are root path");
      return true;
    }

    // example:
    // - '/bora', prefix = '/'
    // - '/bora/dora', prefix = '/'
    if (is_absolute_path() && prefix.is_root_path()) {
      // DCOUT("prefix is root path");
      return true;
    }

    const std::vector<std::string> prim_names = split(prim_part(), "/");
    const std::vector<std::string> prefix_prim_names =
        split(prefix.prim_part(), "/");
    // DCOUT("prim_names = " << to_string(prim_names));
    // DCOUT("prefix.prim_names = " << to_string(prefix_prim_names));

    if (prim_names.empty() || prefix_prim_names.empty()) {
      return false;
    }

    if (prim_names.size() < prefix_prim_names.size()) {
      return false;
    }

    size_t depth = prefix_prim_names.size();
    if (depth < 1) {  // just in case
      return false;
    }

    // Move to prefix's path depth and compare each elementName of Prim tree
    // towards the root. comapre from tail would find a difference earlier.
    while (depth > 0) {
      if (prim_names[depth - 1] != prefix_prim_names[depth - 1]) {
        return false;
      }
      depth--;
    }

    // DCOUT("has_prefix");
    return true;

  } else {
    // TODO: property-only path.
    DCOUT("TODO: Unsupported Path type in has_prefix()");
    return false;
  }
}